

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

array<float,_2>
pbrt::Checkerboard(AAMethod aaMethod,TextureEvalContext ctx,TextureMapping2DHandle *map2D,
                  TextureMapping3DHandle *map3D)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  initializer_list<float> v;
  initializer_list<float> v_00;
  initializer_list<float> v_01;
  initializer_list<float> v_02;
  initializer_list<float> v_03;
  initializer_list<float> v_04;
  initializer_list<float> v_05;
  TextureEvalContext ctx_00;
  TextureEvalContext ctx_01;
  bool bVar3;
  int iVar4;
  float *pfVar5;
  TaggedPointer *in_RDX;
  TaggedPointer *in_RSI;
  int in_EDI;
  Tuple2<pbrt::Vector2,_float> *pTVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  float fVar9;
  float fVar10;
  double dVar11;
  array<float,_2> aVar12;
  undefined1 extraout_var [56];
  undefined1 auVar15 [56];
  Point3f PVar16;
  Point3f p;
  Vector3f dpdy;
  Vector3f dpdx;
  Float area2;
  Float tint;
  Float sint;
  anon_class_1_0_00000001 bumpInt;
  Float t1;
  Float t0;
  Float s1;
  Float s0;
  Float dt;
  Float ds;
  Point2f st;
  Vector2f dstdy;
  Vector2f dstdx;
  array<float,_2> *paVar18;
  undefined1 auVar17 [44];
  iterator in_stack_fffffffffffffdc8;
  char (*in_stack_fffffffffffffdd0) [7];
  undefined1 *puVar19;
  Vector2f *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffde4;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  undefined4 in_stack_fffffffffffffdf0;
  LogLevel in_stack_fffffffffffffdf4;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  TextureMapping3DHandle *in_stack_fffffffffffffe00;
  Tuple2<pbrt::Vector2,_float> *pTVar20;
  undefined1 (*pauVar21) [64];
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  undefined8 in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  undefined8 in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  undefined1 local_134 [12];
  float local_128;
  float local_124;
  float *local_120;
  undefined8 local_118;
  float local_110;
  float local_10c;
  float local_108;
  undefined4 local_100;
  undefined4 local_fc;
  undefined4 *local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  undefined4 local_e4;
  undefined4 *local_e0;
  undefined8 local_d8;
  float local_d0;
  float local_cc;
  float local_c8;
  float local_c4;
  float local_c0;
  float local_bc;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined4 *local_a0;
  undefined8 local_98;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 *local_88;
  undefined8 local_80;
  undefined1 local_78 [64];
  Tuple2<pbrt::Point2,_float> local_38;
  Tuple2<pbrt::Vector2,_float> local_30;
  Tuple2<pbrt::Vector2,_float> local_28 [3];
  int local_c;
  float local_8 [2];
  array<float,_2> aVar13;
  array<float,_2> aVar14;
  
  pauVar21 = (undefined1 (*) [64])&stack0x00000008;
  local_c = in_EDI;
  bVar3 = TaggedPointer::operator_cast_to_bool(in_RSI);
  if (bVar3) {
    bVar3 = TaggedPointer::operator_cast_to_bool(in_RDX);
    if (bVar3) {
      LogFatal<char_const(&)[7]>
                (in_stack_fffffffffffffdf4,
                 (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                 in_stack_fffffffffffffde4,(char *)in_stack_fffffffffffffdd8,
                 in_stack_fffffffffffffdd0);
    }
    pTVar6 = local_28;
    Vector2<float>::Vector2((Vector2<float> *)0x4f27bf);
    pTVar20 = &local_30;
    Vector2<float>::Vector2((Vector2<float> *)0x4f27d4);
    auVar7 = vmovdqu64_avx512f(*pauVar21);
    local_78 = vmovdqu64_avx512f(auVar7);
    auVar7 = vmovdqu64_avx512f(local_78);
    auVar7 = vmovdqu64_avx512f(auVar7);
    ctx_00._8_8_ = pTVar20;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = pTVar6;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_RDX;
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_RSI;
    ctx_00._32_8_ = pauVar21;
    ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)in_stack_fffffffffffffe28;
    ctx_00.dudx = (Float)in_stack_fffffffffffffe2c;
    ctx_00.dudy = (Float)(int)in_stack_fffffffffffffe30;
    ctx_00.dvdx = (Float)(int)((ulong)in_stack_fffffffffffffe30 >> 0x20);
    ctx_00.dvdy = (Float)(int)in_stack_fffffffffffffe38;
    ctx_00.faceIndex = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
    auVar8._0_8_ = TextureMapping2DHandle::Map
                             ((TextureMapping2DHandle *)
                              CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),ctx_00,
                              (Vector2f *)
                              CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                              in_stack_fffffffffffffdd8);
    paVar18 = auVar7._56_8_;
    auVar8._8_56_ = extraout_var;
    local_38 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar8._0_16_);
    if (local_c == 0) {
      pfVar5 = Tuple2<pbrt::Point2,_float>::operator[](&local_38,0);
      dVar11 = std::floor((double)(ulong)(uint)*pfVar5);
      iVar4 = (int)SUB84(dVar11,0);
      pfVar5 = Tuple2<pbrt::Point2,_float>::operator[](&local_38,1);
      dVar11 = std::floor((double)(ulong)(uint)*pfVar5);
      if ((iVar4 + (int)SUB84(dVar11,0)) % 2 == 0) {
        local_90 = 0x3f800000;
        local_8c = 0;
        local_88 = &local_90;
        local_80 = 2;
        v._M_len = (size_type)in_stack_fffffffffffffdd0;
        v._M_array = in_stack_fffffffffffffdc8;
        pstd::array<float,_2>::array(paVar18,v);
      }
      else {
        local_a8 = 0;
        local_a4 = 0x3f800000;
        local_a0 = &local_a8;
        local_98 = 2;
        v_00._M_len = (size_type)in_stack_fffffffffffffdd0;
        v_00._M_array = in_stack_fffffffffffffdc8;
        pstd::array<float,_2>::array(paVar18,v_00);
      }
    }
    else {
      pTVar6 = local_28;
      pfVar5 = Tuple2<pbrt::Vector2,_float>::operator[](pTVar6,0);
      fVar9 = *pfVar5;
      std::abs((int)pTVar6);
      pTVar6 = &local_30;
      local_b0 = fVar9;
      pfVar5 = Tuple2<pbrt::Vector2,_float>::operator[](pTVar6,0);
      fVar9 = *pfVar5;
      std::abs((int)pTVar6);
      local_b4 = fVar9;
      pfVar5 = std::max<float>(&local_b0,&local_b4);
      local_ac = *pfVar5;
      pTVar6 = local_28;
      pfVar5 = Tuple2<pbrt::Vector2,_float>::operator[](pTVar6,1);
      fVar9 = *pfVar5;
      std::abs((int)pTVar6);
      pTVar6 = &local_30;
      local_bc = fVar9;
      pfVar5 = Tuple2<pbrt::Vector2,_float>::operator[](pTVar6,1);
      fVar9 = *pfVar5;
      std::abs((int)pTVar6);
      local_c0 = fVar9;
      pfVar5 = std::max<float>(&local_bc,&local_c0);
      local_b8 = *pfVar5;
      pfVar5 = Tuple2<pbrt::Point2,_float>::operator[](&local_38,0);
      local_c4 = *pfVar5 - local_ac;
      pfVar5 = Tuple2<pbrt::Point2,_float>::operator[](&local_38,0);
      local_c8 = *pfVar5 + local_ac;
      pfVar5 = Tuple2<pbrt::Point2,_float>::operator[](&local_38,1);
      local_cc = *pfVar5 - local_b8;
      pfVar5 = Tuple2<pbrt::Point2,_float>::operator[](&local_38,1);
      local_d0 = *pfVar5 + local_b8;
      dVar11 = std::floor((double)(ulong)(uint)local_c4);
      fVar9 = SUB84(dVar11,0);
      dVar11 = std::floor((double)(ulong)(uint)local_c8);
      if ((fVar9 == SUB84(dVar11,0)) && (!NAN(fVar9) && !NAN(SUB84(dVar11,0)))) {
        dVar11 = std::floor((double)(ulong)(uint)local_cc);
        fVar9 = SUB84(dVar11,0);
        dVar11 = std::floor((double)(ulong)(uint)local_d0);
        paVar18 = auVar7._56_8_;
        if ((fVar9 == SUB84(dVar11,0)) && (!NAN(fVar9) && !NAN(SUB84(dVar11,0)))) {
          pfVar5 = Tuple2<pbrt::Point2,_float>::operator[](&local_38,0);
          dVar11 = std::floor((double)(ulong)(uint)*pfVar5);
          iVar4 = (int)SUB84(dVar11,0);
          pfVar5 = Tuple2<pbrt::Point2,_float>::operator[](&local_38,1);
          dVar11 = std::floor((double)(ulong)(uint)*pfVar5);
          if ((iVar4 + (int)SUB84(dVar11,0)) % 2 == 0) {
            local_e8 = 0x3f800000;
            local_e4 = 0;
            local_e0 = &local_e8;
            local_d8 = 2;
            v_01._M_len = (size_type)in_stack_fffffffffffffdd0;
            v_01._M_array = in_stack_fffffffffffffdc8;
            pstd::array<float,_2>::array(paVar18,v_01);
            aVar14.values[0] = local_8[0];
            aVar14.values[1] = local_8[1];
            return (array<float,_2>)aVar14.values;
          }
          local_100 = 0;
          local_fc = 0x3f800000;
          local_f8 = &local_100;
          local_f0 = 2;
          v_02._M_len = (size_type)in_stack_fffffffffffffdd0;
          v_02._M_array = in_stack_fffffffffffffdc8;
          pstd::array<float,_2>::array(paVar18,v_02);
          aVar13.values[0] = local_8[0];
          aVar13.values[1] = local_8[1];
          return (array<float,_2>)aVar13.values;
        }
      }
      fVar9 = Checkerboard::anon_class_1_0_00000001::operator()(auVar7._24_8_,auVar7._20_4_);
      fVar10 = Checkerboard::anon_class_1_0_00000001::operator()(auVar7._24_8_,auVar7._20_4_);
      auVar17 = auVar7._56_44_;
      local_108 = (fVar9 - fVar10) / (local_ac * 2.0);
      fVar9 = Checkerboard::anon_class_1_0_00000001::operator()(auVar7._24_8_,auVar7._20_4_);
      paVar18 = auVar17._36_8_;
      fVar10 = Checkerboard::anon_class_1_0_00000001::operator()(auVar17._4_8_,auVar17._0_4_);
      local_10c = (fVar9 - fVar10) / (local_b8 * 2.0);
      auVar2 = vfmadd213ss_fma(ZEXT416((uint)local_10c),ZEXT416((uint)-(local_108 * 2.0)),
                               ZEXT416((uint)(local_108 + local_10c)));
      local_110 = auVar2._0_4_;
      if ((1.0 < local_ac) || (1.0 < local_b8)) {
        local_110 = 0.5;
      }
      local_128 = 1.0 - local_110;
      local_124 = local_110;
      local_120 = &local_128;
      local_118 = 2;
      v_03._M_len = (size_type)in_stack_fffffffffffffdd0;
      v_03._M_array = in_stack_fffffffffffffdc8;
      pstd::array<float,_2>::array(paVar18,v_03);
    }
  }
  else {
    bVar3 = TaggedPointer::operator_cast_to_bool(in_RDX);
    if (!bVar3) {
      LogFatal<char_const(&)[6]>
                (in_stack_fffffffffffffdf4,
                 (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                 in_stack_fffffffffffffde4,(char *)in_stack_fffffffffffffdd8,
                 (char (*) [6])in_stack_fffffffffffffdd0);
    }
    puVar19 = local_134;
    Vector3<float>::Vector3((Vector3<float> *)0x4f2e16);
    Vector3<float>::Vector3((Vector3<float> *)0x4f2e28);
    auVar7 = vmovdqu64_avx512f(*pauVar21);
    auVar7 = vmovdqu64_avx512f(auVar7);
    auVar8 = vmovdqu64_avx512f(auVar7);
    auVar7 = vmovdqu64_avx512f(auVar8);
    paVar18 = auVar7._56_8_;
    auVar15 = ZEXT856(auVar8._8_8_);
    ctx_01.p.super_Tuple3<pbrt::Point3,_float>.z = (float)in_stack_fffffffffffffe28;
    ctx_01.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = pauVar21;
    ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffe2c;
    ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_fffffffffffffe30;
    ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.z =
         (float)(int)((ulong)in_stack_fffffffffffffe30 >> 0x20);
    ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffe38;
    ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.y =
         (float)(int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
    ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)in_stack_fffffffffffffe40;
    ctx_01.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)in_stack_fffffffffffffe44;
    ctx_01.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)in_stack_fffffffffffffe48;
    ctx_01.dudx = (Float)(int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
    ctx_01.dudy = (Float)(int)in_stack_fffffffffffffe50;
    ctx_01.dvdx = (Float)(int)((ulong)in_stack_fffffffffffffe50 >> 0x20);
    ctx_01.dvdy = (Float)(int)in_stack_fffffffffffffe58;
    ctx_01.faceIndex = (int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
    PVar16 = TextureMapping3DHandle::Map
                       (in_stack_fffffffffffffe00,ctx_01,
                        (Vector3f *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                        (Vector3f *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    auVar7._0_8_ = PVar16.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar7._8_56_ = auVar15;
    uVar1 = vmovlpd_avx(auVar7._0_16_);
    dVar11 = std::floor((double)(uVar1 & 0xffffffff));
    iVar4 = (int)SUB84(dVar11,0);
    dVar11 = std::floor((double)(uVar1 >> 0x20));
    iVar4 = iVar4 + (int)SUB84(dVar11,0);
    dVar11 = std::floor((double)(ulong)(uint)PVar16.super_Tuple3<pbrt::Point3,_float>.z);
    if ((iVar4 + (int)SUB84(dVar11,0)) % 2 == 0) {
      v_04._M_len = (size_type)puVar19;
      v_04._M_array = in_stack_fffffffffffffdc8;
      pstd::array<float,_2>::array(paVar18,v_04);
    }
    else {
      v_05._M_len = (size_type)puVar19;
      v_05._M_array = in_stack_fffffffffffffdc8;
      pstd::array<float,_2>::array(paVar18,v_05);
    }
  }
  aVar12.values[0] = local_8[0];
  aVar12.values[1] = local_8[1];
  return (array<float,_2>)aVar12.values;
}

Assistant:

pstd::array<Float, 2> Checkerboard(AAMethod aaMethod, TextureEvalContext ctx,
                                   const TextureMapping2DHandle map2D,
                                   const TextureMapping3DHandle map3D) {
    if (map2D) {
        CHECK(!map3D);
        Vector2f dstdx, dstdy;
        Point2f st = map2D.Map(ctx, &dstdx, &dstdy);
        if (aaMethod == AAMethod::None) {
            // Point sample _Checkerboard2DTexture_
            if (((int)std::floor(st[0]) + (int)std::floor(st[1])) % 2 == 0)
                return {Float(1), Float(0)};
            return {Float(0), Float(1)};
        } else {
            // Compute closed-form box-filtered _Checkerboard2DTexture_ value

            // Evaluate single check if filter is entirely inside one of them
            Float ds = std::max(std::abs(dstdx[0]), std::abs(dstdy[0]));
            Float dt = std::max(std::abs(dstdx[1]), std::abs(dstdy[1]));
            Float s0 = st[0] - ds, s1 = st[0] + ds;
            Float t0 = st[1] - dt, t1 = st[1] + dt;
            if (std::floor(s0) == std::floor(s1) && std::floor(t0) == std::floor(t1)) {
                // Point sample _Checkerboard2DTexture_
                if (((int)std::floor(st[0]) + (int)std::floor(st[1])) % 2 == 0)
                    return {Float(1), Float(0)};
                return {Float(0), Float(1)};
            }

            // Apply box filter to checkerboard region
            auto bumpInt = [](Float x) {
                return (int)std::floor(x / 2) +
                       2 * std::max(x / 2 - (int)std::floor(x / 2) - (Float)0.5,
                                    (Float)0);
            };
            Float sint = (bumpInt(s1) - bumpInt(s0)) / (2 * ds);
            Float tint = (bumpInt(t1) - bumpInt(t0)) / (2 * dt);
            Float area2 = sint + tint - 2 * sint * tint;
            if (ds > 1 || dt > 1)
                area2 = .5f;
            return {(1 - area2), area2};
        }
    } else {
        CHECK(map3D);
        Vector3f dpdx, dpdy;
        Point3f p = map3D.Map(ctx, &dpdx, &dpdy);
        if (((int)std::floor(p.x) + (int)std::floor(p.y) + (int)std::floor(p.z)) % 2 == 0)
            return {Float(1), Float(0)};
        return {Float(0), Float(1)};
    }
}